

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O2

ReferenceCounterValueType __thiscall Diligent::RefCountersImpl::AddStrongRef(RefCountersImpl *this)

{
  atomic<int> *paVar1;
  int iVar2;
  string msg;
  
  if ((this->m_ObjectState)._M_i != Alive) {
    FormatString<char[92]>
              (&msg,(char (*) [92])
                    "Attempting to increment strong reference counter for a destroyed or not initialized object!"
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"AddStrongRef",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
               ,0x33);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((this->m_ObjectWrapperBuffer[0] == 0) || (this->m_ObjectWrapperBuffer[1] == 0)) {
    FormatString<char[34]>(&msg,(char (*) [34])"Object wrapper is not initialized");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"AddStrongRef",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
               ,0x34);
    std::__cxx11::string::~string((string *)&msg);
  }
  LOCK();
  paVar1 = &this->m_NumStrongReferences;
  iVar2 = (paVar1->super___atomic_base<int>)._M_i;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  return iVar2 + 1;
}

Assistant:

inline virtual ReferenceCounterValueType AddStrongRef() override final
    {
        VERIFY(m_ObjectState.load() == ObjectState::Alive, "Attempting to increment strong reference counter for a destroyed or not initialized object!");
        VERIFY(m_ObjectWrapperBuffer[0] != 0 && m_ObjectWrapperBuffer[1] != 0, "Object wrapper is not initialized");
        return m_NumStrongReferences.fetch_add(+1) + 1;
    }